

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<8,_457>::Type
          (Type<8,_457> *this,int zaid,double awr,int lis,int liso,AverageDecayEnergies *energies,
          DecayModes *modes,
          vector<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
          *spectra)

{
  pointer pDVar1;
  
  BaseWithoutMT<njoy::ENDFtk::section::Type<8,_457>_>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_457>_>,zaid,awr);
  this->lis_ = lis;
  this->liso_ = liso;
  this->nst_ = *(int *)&(modes->super_ListRecord).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long> == 0;
  ListRecord::ListRecord(&(this->energies_).super_ListRecord,&energies->super_ListRecord);
  ListRecord::ListRecord(&(this->modes_).super_ListRecord,&modes->super_ListRecord);
  pDVar1 = (spectra->
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (spectra->
       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar1;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spectra->
       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Type( int zaid, double awr, int lis, int liso,
      AverageDecayEnergies&& energies,
      DecayModes&& modes,
      std::vector< DecaySpectrum >&& spectra ) :
  BaseWithoutMT( zaid, awr ),
  lis_( lis ), liso_( liso ), nst_( modes.NDK() == 0 ),
  energies_( std::move( energies ) ),
  modes_( std::move( modes ) ),
  spectra_( std::move( spectra ) ) {}